

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

SoundAnalysisPreprocessing_Vggish *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
          (Arena *arena)

{
  SoundAnalysisPreprocessing_Vggish *this;
  
  if (arena == (Arena *)0x0) {
    this = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
    CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::
    SoundAnalysisPreprocessing_Vggish(this,(Arena *)0x0,false);
  }
  else {
    this = (SoundAnalysisPreprocessing_Vggish *)
           AllocateAlignedWithHook
                     (arena,0x18,
                      (type_info *)
                      &CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::
                       typeinfo);
    CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::
    SoundAnalysisPreprocessing_Vggish(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }